

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O2

void __thiscall
Assimp::SpatialSort::FindIdenticalPositions
          (SpatialSort *this,aiVector3D *pPosition,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  ai_real aVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ai_real aVar9;
  pointer pEVar10;
  float fVar11;
  float fVar12;
  aiVector3t<float> aVar13;
  
  fVar11 = operator*(pPosition,&this->mPlaneNormal);
  fVar2 = (float)(-0x80000000 - (int)fVar11);
  if (-1 < (int)fVar11) {
    fVar2 = fVar11;
  }
  iVar7 = (int)fVar2 + -5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(poResults,0);
  pEVar10 = (this->mPositions).
            super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar10) / 0x14;
  uVar4 = uVar3 >> 1 & 0x7fffffff;
  uVar6 = uVar3 >> 2 & 0x3fffffff;
  while (uVar5 = (uint)uVar6, 1 < uVar5) {
    aVar1 = pEVar10[uVar4].mDistance;
    aVar9 = (ai_real)(-0x80000000 - (int)aVar1);
    if (-1 < (int)aVar1) {
      aVar9 = aVar1;
    }
    uVar8 = uVar5;
    if (iVar7 <= (int)aVar9) {
      uVar8 = -uVar5;
    }
    uVar4 = (ulong)((int)uVar4 + uVar8);
    uVar6 = (ulong)(uVar5 >> 1);
  }
  do {
    uVar6 = uVar4;
    if ((int)uVar6 == 0) break;
    aVar1 = pEVar10[uVar6].mDistance;
    aVar9 = (ai_real)(-0x80000000 - (int)aVar1);
    if (-1 < (int)aVar1) {
      aVar9 = aVar1;
    }
    uVar4 = (ulong)((int)uVar6 - 1);
  } while (iVar7 < (int)aVar9);
  do {
    uVar4 = uVar6;
    if (uVar3 - 1 <= uVar4) break;
    aVar1 = pEVar10[uVar4].mDistance;
    aVar9 = (ai_real)(-0x80000000 - (int)aVar1);
    if (-1 < (int)aVar1) {
      aVar9 = aVar1;
    }
    uVar6 = (ulong)((int)uVar4 + 1);
  } while ((int)aVar9 < iVar7);
  pEVar10 = pEVar10 + uVar4;
  while( true ) {
    aVar1 = pEVar10->mDistance;
    aVar9 = (ai_real)(-0x80000000 - (int)aVar1);
    if (-1 < (int)aVar1) {
      aVar9 = aVar1;
    }
    if ((int)fVar2 + 5 <= (int)aVar9) break;
    aVar13 = operator-(&pEVar10->mPosition,pPosition);
    fVar12 = aVar13.z * aVar13.z + aVar13.x * aVar13.x + aVar13.y * aVar13.y;
    fVar11 = (float)(-0x80000000 - (int)fVar12);
    if (-1 < (int)fVar12) {
      fVar11 = fVar12;
    }
    if ((int)fVar11 < 7) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (poResults,&pEVar10->mIndex);
    }
    pEVar10 = pEVar10 + 1;
    if (pEVar10 ==
        (this->mPositions).
        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
  }
  return;
}

Assistant:

void SpatialSort::FindIdenticalPositions( const aiVector3D& pPosition,
    std::vector<unsigned int>& poResults) const
{
    // Epsilons have a huge disadvantage: they are of constant precision, while floating-point
    //  values are of log2 precision. If you apply e=0.01 to 100, the epsilon is rather small, but
    //  if you apply it to 0.001, it is enormous.

    // The best way to overcome this is the unit in the last place (ULP). A precision of 2 ULPs
    //  tells us that a float does not differ more than 2 bits from the "real" value. ULPs are of
    //  logarithmic precision - around 1, they are 1*(2^24) and around 10000, they are 0.00125.

    // For standard C math, we can assume a precision of 0.5 ULPs according to IEEE 754. The
    //  incoming vertex positions might have already been transformed, probably using rather
    //  inaccurate SSE instructions, so we assume a tolerance of 4 ULPs to safely identify
    //  identical vertex positions.
    static const int toleranceInULPs = 4;
    // An interesting point is that the inaccuracy grows linear with the number of operations:
    //  multiplying to numbers, each inaccurate to four ULPs, results in an inaccuracy of four ULPs
    //  plus 0.5 ULPs for the multiplication.
    // To compute the distance to the plane, a dot product is needed - that is a multiplication and
    //  an addition on each number.
    static const int distanceToleranceInULPs = toleranceInULPs + 1;
    // The squared distance between two 3D vectors is computed the same way, but with an additional
    //  subtraction.
    static const int distance3DToleranceInULPs = distanceToleranceInULPs + 1;

    // Convert the plane distance to its signed integer representation so the ULPs tolerance can be
    //  applied. For some reason, VC won't optimize two calls of the bit pattern conversion.
    const BinFloat minDistBinary = ToBinary( pPosition * mPlaneNormal) - distanceToleranceInULPs;
    const BinFloat maxDistBinary = minDistBinary + 2 * distanceToleranceInULPs;

    // clear the array in this strange fashion because a simple clear() would also deallocate
    // the array which we want to avoid
    poResults.resize( 0 );

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        // Ugly, but conditional jumps are faster with integers than with floats
        if( minDistBinary > ToBinary(mPositions[index].mDistance))
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && minDistBinary < ToBinary(mPositions[index].mDistance) )
        index--;
    while( index < (mPositions.size() - 1) && minDistBinary > ToBinary(mPositions[index].mDistance))
        index++;

    // Now start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the tolerance to the result array
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    while( ToBinary(it->mDistance) < maxDistBinary)
    {
        if( distance3DToleranceInULPs >= ToBinary((it->mPosition - pPosition).SquareLength()))
            poResults.push_back(it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}